

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_doing(Curl_easy *data,_Bool *dophase_done)

{
  char *local_40;
  char *local_30;
  CURLcode local_1c;
  CURLcode result;
  _Bool *dophase_done_local;
  Curl_easy *data_local;
  
  local_1c = ftp_multi_statemach(data,dophase_done);
  if (local_1c == CURLE_OK) {
    if ((((((*dophase_done & 1U) != 0) &&
          (local_1c = ftp_dophase_done(data,false), data != (Curl_easy *)0x0)) &&
         ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_ftp.log_level)) {
      if ((data == (Curl_easy *)0x0) || (data->conn == (connectdata *)0x0)) {
        local_40 = "???";
      }
      else {
        local_40 = ftp_state_names[(data->conn->proto).ftpc.state];
      }
      Curl_trc_ftp(data,"[%s] DO phase is complete2",local_40);
    }
  }
  else if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) && (0 < Curl_trc_feat_ftp.log_level)) {
    if ((data == (Curl_easy *)0x0) || (data->conn == (connectdata *)0x0)) {
      local_30 = "???";
    }
    else {
      local_30 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] DO phase failed",local_30);
  }
  return local_1c;
}

Assistant:

static CURLcode ftp_doing(struct Curl_easy *data,
                          bool *dophase_done)
{
  CURLcode result = ftp_multi_statemach(data, dophase_done);

  if(result)
    CURL_TRC_FTP(data, "[%s] DO phase failed", FTP_DSTATE(data));
  else if(*dophase_done) {
    result = ftp_dophase_done(data, FALSE /* not connected */);

    CURL_TRC_FTP(data, "[%s] DO phase is complete2", FTP_DSTATE(data));
  }
  return result;
}